

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double chisq_pq2s(pqpair pq,double dof)

{
  int which;
  double q;
  double p;
  int status;
  double bound;
  double df;
  double x;
  int local_3c;
  double local_38;
  double local_30;
  int local_24;
  double local_20;
  double local_18;
  double local_10;
  
  local_38 = pq.q;
  local_30 = pq.p;
  local_3c = 2;
  local_10 = 0.0;
  if (0.0 < local_30) {
    if (local_38 <= 0.0) {
      local_10 = 9.99e+37;
    }
    else {
      local_10 = 0.0;
      local_18 = dof;
      cdfchi(&local_3c,&local_30,&local_38,&local_10,&local_18,&local_24,&local_20);
    }
  }
  return local_10;
}

Assistant:

static double chisq_pq2s( pqpair pq , double dof )
{
   int which , status ;
   double p,q,x,df,bound ;

   which  = 2 ;
   p      = pq.p ; if( p <= 0.0 ) return  0.0 ;
   q      = pq.q ; if( q <= 0.0 ) return BIGG ;
   x      = 0.0 ;
   df     = dof ;

   cdfchi( &which , &p , &q , &x , &df , &status , &bound ) ;
   return x ;
}